

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

string * convertWStringToUtf8_abi_cxx11_(string *__return_storage_ptr__,wstring_view source)

{
  uint uVar1;
  byte bVar2;
  size_type sVar3;
  uint *puVar4;
  ulong uStack_30;
  wchar_t character;
  size_t i;
  undefined1 local_20 [8];
  wstring_view source_local;
  string *result;
  
  source_local._M_len = (size_t)source._M_str;
  local_20 = (undefined1  [8])source._M_len;
  source_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (uStack_30 = 0;
      sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_20),
      uStack_30 < sVar3; uStack_30 = uStack_30 + 1) {
    puVar4 = (uint *)std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                               ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_20,
                                uStack_30);
    uVar1 = *puVar4;
    bVar2 = (byte)uVar1;
    if ((int)uVar1 < 0x80) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar2 & 0x7f);
    }
    else if ((int)uVar1 < 0x800) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(byte)(uVar1 >> 6) & 0x1f | 0xc0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar2 & 0x3f | 0x80);
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(byte)(uVar1 >> 0xc) & 0xf | 0xe0);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(byte)(uVar1 >> 6) & 0x3f | 0x80);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar2 & 0x3f | 0x80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertWStringToUtf8(std::wstring_view source)
{
	std::string result;
	
	for (size_t i = 0; i < source.size(); i++)
	{
		wchar_t character = source[i];
		if (character < 0x80)
		{
			result += character & 0x7F;
		} else if (character < 0x800)
		{
			result += 0xC0 | ((character >> 6) & 0x1F);
			result += (0x80 | (character & 0x3F));
		} else {
			result += 0xE0 | ((character >> 12) & 0xF);
			result += 0x80 | ((character >> 6) & 0x3F);
			result += 0x80 | (character & 0x3F);
		}
	}

	return result;
}